

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddConfidentialTxIn
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t sequence,
              char **tx_string)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RDX;
  Txid *in_RSI;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionController ctxc;
  AbstractTransactionController *in_stack_fffffffffffffc38;
  ConfidentialTxInReference *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  ConfidentialTransactionController *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffc60;
  ConfidentialTransactionController *this;
  string *in_stack_fffffffffffffca0;
  string local_340 [39];
  allocator local_319;
  string local_318;
  Txid local_2f8 [12];
  undefined1 local_171 [119];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined8 *local_30;
  char *local_20;
  Txid *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_30 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0xcc;
    local_58.funcname = "CfdAddConfidentialTxIn";
    cfd::core::logger::warn<>(&local_58,"tx is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. tx is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc60,error_code,(string *)in_stack_fffffffffffffc50);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    if (local_30 == (undefined8 *)0x0) {
      local_d8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_d8.filename = local_d8.filename + 1;
      local_d8.line = 0xd8;
      local_d8.funcname = "CfdAddConfidentialTxIn";
      cfd::core::logger::warn<>(&local_d8,"tx output is null.");
      local_fa = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"Failed to parameter. tx output is null.",&local_f9);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffc60,error_code,(string *)in_stack_fffffffffffffc50);
      local_fa = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    this = (ConfidentialTransactionController *)local_171;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_171 + 1),(char *)local_18,(allocator *)this);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::__cxx11::string::~string((string *)(local_171 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_171);
    paVar4 = &local_319;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,local_20,paVar4);
    cfd::core::Txid::Txid(local_2f8,&local_318);
    cfd::ConfidentialTransactionController::AddTxIn
              (this,local_18,(uint32_t)((ulong)paVar4 >> 0x20),(uint32_t)paVar4);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffc40);
    cfd::core::Txid::~Txid((Txid *)0x5a348c);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    cfd::AbstractTransactionController::GetHex_abi_cxx11_(in_stack_fffffffffffffc38);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffca0);
    *local_30 = pcVar3;
    std::__cxx11::string::~string(local_340);
    local_4 = 0;
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController
              ((ConfidentialTransactionController *)in_stack_fffffffffffffc40);
    return local_4;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0xd2;
  local_98.funcname = "CfdAddConfidentialTxIn";
  cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
  local_ba = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",&local_b9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffc60,error_code,(string *)in_stack_fffffffffffffc50);
  local_ba = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxIn(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t sequence, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    ctxc.AddTxIn(Txid(txid), vout, sequence);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}